

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::CodeGenerator::GenerateAll
          (CodeGenerator *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *files,string *parameter,GeneratorContext *generator_context,string *error)

{
  FileDescriptor *pFVar1;
  string *psVar2;
  int iVar3;
  pointer ppFVar4;
  char cVar5;
  AlphaNum *c;
  ulong uVar6;
  string local_e0;
  AlphaNum local_c0;
  AlphaNum local_90;
  size_type local_60;
  pointer local_58;
  
  ppFVar4 = (files->
            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((files->
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish == ppFVar4) {
    cVar5 = '\x01';
  }
  else {
    uVar6 = 0;
    do {
      pFVar1 = ppFVar4[uVar6];
      c = (AlphaNum *)error;
      iVar3 = (*this->_vptr_CodeGenerator[2])(this,pFVar1,parameter,generator_context);
      cVar5 = (char)iVar3;
      if ((error == (string *)0x0) || (cVar5 != '\0')) {
        if (error != (string *)0x0) goto LAB_00149cab;
      }
      else {
        local_c0.piece_._M_len = error->_M_string_length;
        if (local_c0.piece_._M_len != 0) goto LAB_00149cdc;
        c = (AlphaNum *)0x40;
        std::__cxx11::string::_M_replace((ulong)error,0,(char *)0x0,0x2daab0);
LAB_00149cab:
        local_c0.piece_._M_len = error->_M_string_length;
        if (local_c0.piece_._M_len != 0) {
LAB_00149cdc:
          psVar2 = pFVar1->name_;
          local_58 = (psVar2->_M_dataplus)._M_p;
          local_60 = psVar2->_M_string_length;
          local_90.piece_._M_len = 2;
          local_90.piece_._M_str = ": ";
          local_c0.piece_._M_str = (error->_M_dataplus)._M_p;
          absl::lts_20250127::StrCat_abi_cxx11_
                    (&local_e0,(lts_20250127 *)&local_60,&local_90,&local_c0,c);
          std::__cxx11::string::operator=((string *)error,(string *)&local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p == &local_e0.field_2) {
            return (bool)cVar5;
          }
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          return (bool)cVar5;
        }
      }
      if (cVar5 == '\0') {
        return false;
      }
      uVar6 = uVar6 + 1;
      ppFVar4 = (files->
                super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(files->
                                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar4 >> 3)
            );
  }
  return (bool)cVar5;
}

Assistant:

bool CodeGenerator::GenerateAll(const std::vector<const FileDescriptor*>& files,
                                const std::string& parameter,
                                GeneratorContext* generator_context,
                                std::string* error) const {
  // Default implementation is just to call the per file method, and prefix any
  // error string with the file to provide context.
  bool succeeded = true;
  for (size_t i = 0; i < files.size(); i++) {
    const FileDescriptor* file = files[i];
    succeeded = Generate(file, parameter, generator_context, error);
    if (!succeeded && error && error->empty()) {
      *error =
          "Code generator returned false but provided no error "
          "description.";
    }
    if (error && !error->empty()) {
      *error = absl::StrCat(file->name(), ": ", *error);
      break;
    }
    if (!succeeded) {
      break;
    }
  }
  return succeeded;
}